

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

Bool SetOptionValue(TidyDocImpl *doc,TidyOptionId optId,ctmbstr val)

{
  uint uVar1;
  TidyOptionImpl *option_00;
  tmbstr ptVar2;
  TidyOptionValue *oldval;
  Bool status;
  Bool fire_callback;
  TidyOptionImpl *option;
  ctmbstr val_local;
  TidyOptionId optId_local;
  TidyDocImpl *doc_local;
  
  option_00 = option_defs + optId;
  oldval._4_4_ = no;
  if (optId < N_TIDY_OPTIONS != no) {
    if ((option_00->id != optId) || (option_defs[optId].type != TidyString)) {
      __assert_fail("option->id == optId && option->type == TidyString",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/config.c"
                    ,0x1a9,"Bool SetOptionValue(TidyDocImpl *, TidyOptionId, ctmbstr)");
    }
    if (doc->pConfigChangeCallback != (TidyConfigChangeCallback)0x0) {
      oldval._4_4_ = OptionChangedValuesDiffer((doc->config).value[optId].p,val);
    }
    FreeOptionValue(doc,option_00,(doc->config).value + optId);
    uVar1 = prvTidytmbstrlen(val);
    if (uVar1 == 0) {
      (doc->config).value[optId].v = 0;
    }
    else {
      ptVar2 = prvTidytmbstrdup(doc->allocator,val);
      (doc->config).value[optId].p = ptVar2;
    }
  }
  if (oldval._4_4_ != no) {
    PerformOptionChangedCallback(doc,option_00);
  }
  return (uint)(optId < N_TIDY_OPTIONS);
}

Assistant:

static Bool SetOptionValue( TidyDocImpl* doc, TidyOptionId optId, ctmbstr val )
{
    const TidyOptionImpl* option = &option_defs[ optId ];
    Bool fire_callback = no;
    Bool status = ( optId < N_TIDY_OPTIONS );

    if ( status )
    {
        assert( option->id == optId && option->type == TidyString );

        /* Compare the old and new values. */
        if ( doc->pConfigChangeCallback )
        {
            TidyOptionValue* oldval = &(doc->config.value[ optId ]);
            fire_callback = OptionChangedValuesDiffer( oldval->p, val );
        }

        FreeOptionValue( doc, option, &doc->config.value[ optId ] );
        if ( TY_(tmbstrlen)(val)) /* Issue #218 - ONLY if it has LENGTH! */
            doc->config.value[ optId ].p = TY_(tmbstrdup)( doc->allocator, val );
        else
            doc->config.value[ optId ].p = 0; /* should already be zero, but to be sure... */
    }

    if ( fire_callback )
        PerformOptionChangedCallback( doc, option );

    return status;
}